

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

HashTable *
hash_create(void *data,HashTable_HashFn hashfn,HashTable_KeyMatchFn keymatchfn,
           HashTable_NukeFn nukefn,int stackable,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  void *pvVar1;
  HashTable *table;
  uint32 alloc_len;
  uint32 initial_table_size;
  MOJOSHADER_malloc m_local;
  int stackable_local;
  HashTable_NukeFn nukefn_local;
  HashTable_KeyMatchFn keymatchfn_local;
  HashTable_HashFn hashfn_local;
  void *data_local;
  
  data_local = (*m)(0x48,d);
  if ((long *)data_local == (long *)0x0) {
    data_local = (void *)0x0;
  }
  else {
    memset(data_local,0,0x48);
    pvVar1 = (*m)(0x800,d);
    *(void **)data_local = pvVar1;
    if (*data_local == 0) {
      (*f)(data_local,d);
      data_local = (void *)0x0;
    }
    else {
      memset(*data_local,0,0x800);
      *(undefined4 *)((long)data_local + 8) = 0x100;
      *(int *)((long)data_local + 0xc) = stackable;
      *(void **)((long)data_local + 0x10) = data;
      *(HashTable_HashFn *)((long)data_local + 0x18) = hashfn;
      *(HashTable_KeyMatchFn *)((long)data_local + 0x20) = keymatchfn;
      *(HashTable_NukeFn *)((long)data_local + 0x28) = nukefn;
      *(MOJOSHADER_malloc *)((long)data_local + 0x30) = m;
      *(MOJOSHADER_free *)((long)data_local + 0x38) = f;
      *(void **)((long)data_local + 0x40) = d;
    }
  }
  return (HashTable *)data_local;
}

Assistant:

HashTable *hash_create(void *data, const HashTable_HashFn hashfn,
              const HashTable_KeyMatchFn keymatchfn,
              const HashTable_NukeFn nukefn,
              const int stackable,
              MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    const uint32 initial_table_size = 256;
    const uint32 alloc_len = sizeof (HashItem *) * initial_table_size;
    HashTable *table = (HashTable *) m(sizeof (HashTable), d);
    if (table == NULL)
        return NULL;
    memset(table, '\0', sizeof (HashTable));

    table->table = (HashItem **) m(alloc_len, d);
    if (table->table == NULL)
    {
        f(table, d);
        return NULL;
    } // if

    memset(table->table, '\0', alloc_len);
    table->table_len = initial_table_size;
    table->stackable = stackable;
    table->data = data;
    table->hash = hashfn;
    table->keymatch = keymatchfn;
    table->nuke = nukefn;
    table->m = m;
    table->f = f;
    table->d = d;
    return table;
}